

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

_Bool remove_all_send_data_condition_function
                (void *item,void *match_context,_Bool *continue_processing)

{
  IOTHUB_MESSAGING_RESULT messagingResult;
  SEND_CALLBACK_DATA *send_data;
  _Bool *continue_processing_local;
  void *match_context_local;
  void *item_local;
  
  if (*(long *)((long)item + 0x10) != 0) {
    (**(code **)((long)item + 0x10))(*(undefined8 *)((long)item + 0x18),*match_context);
  }
  free(item);
  *continue_processing = true;
  return true;
}

Assistant:

static bool remove_all_send_data_condition_function(const void* item, const void* match_context, bool* continue_processing)
{
    SEND_CALLBACK_DATA* send_data = (SEND_CALLBACK_DATA*)item;
    IOTHUB_MESSAGING_RESULT messagingResult = *(IOTHUB_MESSAGING_RESULT*)match_context;

    if (send_data->callback != NULL)
    {
        send_data->callback(send_data->userContext, messagingResult);
    }

    free(send_data);

    *continue_processing = true;
    return true;
}